

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e6c7d::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  TransformSelectorRegex *this_local;
  
  ~TransformSelectorRegex(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }